

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::replaceData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count,XMLCh *dat)

{
  long *plVar1;
  long lVar2;
  DOMException *this_00;
  MemoryManager **ppMVar3;
  
  if (node == (DOMNode *)0x0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(node,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar1 != (long *)0x0) {
    lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    if (lVar2 != 0) {
      lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
      if ((*(ushort *)(lVar2 + 0x10) & 1) == 0) {
        deleteData(this,node,offset,count);
        insertData(this,node,offset,dat);
        return;
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fDoc == (DOMDocumentImpl *)0x0) {
        ppMVar3 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        ppMVar3 = &this->fDoc->fMemoryManager;
      }
      DOMException::DOMException(this_00,7,0,*ppMVar3);
      goto LAB_00267346;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_00267346:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::replaceData(const DOMNode *node, XMLSize_t offset, XMLSize_t count,
                                    const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    deleteData(node, offset, count);
    insertData(node, offset, dat);
}